

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O2

void __thiscall
TPZSparseBlockDiagonal<float>::BuildFromMatrix
          (TPZSparseBlockDiagonal<float> *this,TPZMatrix<float> *matrix)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long newsize;
  long lVar4;
  long lVar5;
  TPZManVector<long,_10> indices;
  TPZFNMatrix<10000,_float> submat;
  
  TPZManVector<long,_10>::TPZManVector(&indices,0);
  TPZFNMatrix<10000,_float>::TPZFNMatrix(&submat,0,0);
  lVar4 = (this->fBlockIndex).fNElements;
  lVar5 = 1;
  if (1 < lVar4) {
    lVar5 = lVar4;
  }
  for (lVar4 = 0; lVar4 != lVar5 + -1; lVar4 = lVar4 + 1) {
    newsize = (long)(this->super_TPZBlockDiagonal<float>).fBlockSize.fStore[lVar4];
    TPZManVector<long,_10>::Resize(&indices,newsize);
    TPZFMatrix<float>::Resize(&submat.super_TPZFMatrix<float>,newsize,newsize);
    lVar1 = (this->fBlockIndex).fStore[lVar4];
    plVar2 = (this->fBlock).fStore;
    if (newsize < 1) {
      newsize = 0;
    }
    for (lVar3 = 0; newsize != lVar3; lVar3 = lVar3 + 1) {
      indices.super_TPZVec<long>.fStore[lVar3] = plVar2[lVar1 + lVar3];
    }
    (*(matrix->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x49])
              (matrix,&indices,&submat);
    TPZBlockDiagonal<float>::SetBlock
              (&this->super_TPZBlockDiagonal<float>,lVar4,&submat.super_TPZFMatrix<float>);
  }
  TPZFNMatrix<10000,_float>::~TPZFNMatrix(&submat);
  TPZManVector<long,_10>::~TPZManVector(&indices);
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::BuildFromMatrix(TPZMatrix<TVar>& matrix)
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "TPZSparseBlockDiagonal::BuildFromMatrix");
#endif
	TPZManVector<int64_t> indices;
	TPZFNMatrix<10000,TVar> submat(0,0);
	int64_t ibl,nbl = fBlockIndex.NElements()-1;
	for(ibl=0; ibl<nbl; ibl++)
	{
		int64_t nel = this->fBlockSize[ibl];
		indices.Resize(nel);
		submat.Resize(nel,nel);
		int64_t iel,first = fBlockIndex[ibl];
		for(iel=0; iel<nel; iel++) indices[iel] = fBlock[first+iel];
		matrix.GetSub(indices,submat);
		this->SetBlock(ibl,submat);
	}
}